

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

Position * indk::Position::getQuotient(Position *P,float D)

{
  uint _Xm;
  Position *this;
  uint i;
  ulong uVar1;
  float local_5c;
  vector<float,_std::allocator<float>_> PV;
  _Vector_base<float,_std::allocator<float>_> local_40;
  
  PV.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  PV.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  PV.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  for (uVar1 = 0; uVar1 < P->DimensionsCount; uVar1 = uVar1 + 1) {
    local_5c = P->X[uVar1] / D;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&PV,&local_5c);
  }
  this = (Position *)operator_new(0x10);
  _Xm = P->Xm;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_40,&PV);
  Position(this,_Xm,(vector<float,_std::allocator<float>_> *)&local_40);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_40);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&PV.super__Vector_base<float,_std::allocator<float>_>);
  return this;
}

Assistant:

indk::Position* indk::Position::getQuotient(const indk::Position *P, float D) {
    std::vector<float> PV;
    for (unsigned int i = 0; i < P->getDimensionsCount(); i++) {
        PV.push_back(P->getPositionValue(i)/D);
    }
    return new indk::Position(P->getXm(), PV);
}